

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stream_wrapper.hpp
# Opt level: O0

void * pico_tree::internal::open_stream(string *filename,openmode mode)

{
  byte bVar1;
  runtime_error *this;
  _Ios_Openmode in_EDX;
  string *in_RSI;
  void *in_RDI;
  fstream *stream;
  string local_48 [40];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffffe0;
  uint3 in_stack_ffffffffffffffe8;
  uint uVar2;
  
  uVar2 = (uint)in_stack_ffffffffffffffe8;
  ::std::fstream::fstream(in_RDI,in_RSI,in_EDX);
  bVar1 = ::std::fstream::is_open();
  if ((bVar1 & 1) != 0) {
    return in_RDI;
  }
  this = (runtime_error *)__cxa_allocate_exception(0x10);
  ::std::operator+((char *)CONCAT44(in_EDX,uVar2),in_stack_ffffffffffffffe0);
  ::std::runtime_error::runtime_error(this,local_48);
  __cxa_throw(this,&::std::runtime_error::typeinfo,::std::runtime_error::~runtime_error);
}

Assistant:

inline std::fstream open_stream(
    std::string const& filename, std::ios_base::openmode mode) {
  std::fstream stream(filename, mode);

  if (!stream.is_open()) {
    throw std::runtime_error("unable to open file: " + filename);
  }

  return stream;
}